

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblackoilanalysis.cpp
# Opt level: O0

void __thiscall
TPZBlackOilAnalysis::PostProcess(TPZBlackOilAnalysis *this,TPZVec<double> *loc,ostream *out)

{
  ostream *poVar1;
  void *this_00;
  ostream *in_RDX;
  TPZVec<double> *in_RDI;
  REAL T;
  TPZLinearAnalysis *this_01;
  
  this_01 = (TPZLinearAnalysis *)in_RDI[0x29]._vptr_TPZVec;
  poVar1 = std::operator<<(in_RDX,"\nSOLUTION #");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)((long)&in_RDI[0x29].fStore + 4));
  poVar1 = std::operator<<(poVar1," AT TIME = ");
  this_00 = (void *)std::ostream::operator<<(poVar1,(double)this_01);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  TPZLinearAnalysis::PostProcess(this_01,in_RDI,(ostream *)0x1c5fd2c);
  poVar1 = std::operator<<(in_RDX,"\n***************************************\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void TPZBlackOilAnalysis::PostProcess(TPZVec<REAL> &loc, std::ostream &out){
    REAL T = this->fSimulationTime;
    out << "\nSOLUTION #" << this->fCurrentStep << " AT TIME = " << T << std::endl;
    TPZLinearAnalysis::PostProcess(loc, out);
    out << "\n***************************************\n" << std::endl;
}